

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O1

void R_ExecuteSetViewSize(void)

{
  int iVar1;
  
  setsizeneeded = false;
  V_SetBorderNeedRefresh();
  R_SetWindow(setblocks,(screen->super_DSimpleCanvas).super_DCanvas.Width,
              (screen->super_DSimpleCanvas).super_DCanvas.Height,ST_Y,false);
  iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width - viewwidth;
  viewwindowy = ST_Y - viewheight >> 1;
  if (iVar1 == 0) {
    viewwindowy = 0;
  }
  viewwindowx = iVar1 >> 1;
  return;
}

Assistant:

void R_ExecuteSetViewSize ()
{
	setsizeneeded = false;
	V_SetBorderNeedRefresh();

	R_SetWindow (setblocks, SCREENWIDTH, SCREENHEIGHT, ST_Y);

	// Handle resize, e.g. smaller view windows with border and/or status bar.
	viewwindowx = (screen->GetWidth() - viewwidth) >> 1;

	// Same with base row offset.
	viewwindowy = (viewwidth == screen->GetWidth()) ? 0 : (ST_Y - viewheight) >> 1;
}